

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

bool __thiscall absl::Cord::Contains(Cord *this,string_view rhs)

{
  CharIterator local_a0;
  
  if (rhs._M_len != 0) {
    Find(&local_a0,this,rhs);
    return local_a0.chunk_iterator_.bytes_remaining_ != 0;
  }
  return true;
}

Assistant:

bool Cord::Contains(absl::string_view rhs) const {
  return rhs.empty() || Find(rhs) != char_end();
}